

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O3

bool __thiscall
cmELFInternalImpl<cmELFTypes64>::Read(cmELFInternalImpl<cmELFTypes64> *this,ELF_Shdr *x)

{
  basic_istream<char,_std::char_traits<char>_> *pbVar1;
  long *plVar2;
  
  plVar2 = (long *)std::istream::read((char *)(this->super_cmELFInternal).Stream._M_t.
                                              super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                                              ._M_head_impl,(long)x);
  if (((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0) &&
     ((this->super_cmELFInternal).NeedSwap == true)) {
    ByteSwap(this,x);
  }
  pbVar1 = (this->super_cmELFInternal).Stream._M_t.
           super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
           _M_head_impl;
  return ((byte)pbVar1[*(long *)(*(long *)pbVar1 + -0x18) + 0x20] & 5) == 0;
}

Assistant:

bool Read(ELF_Shdr& x)
  {
    if (this->Stream->read(reinterpret_cast<char*>(&x), sizeof(x)) &&
        this->NeedSwap) {
      this->ByteSwap(x);
    }
    return !this->Stream->fail();
  }